

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O3

void telnet_size(Backend *be,int width,int height)

{
  BackendVtable *pBVar1;
  Interactor *pIVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  uchar b [24];
  char local_28 [32];
  
  *(int *)&be[-8].interactor = width;
  *(int *)((long)&be[-8].interactor + 4) = height;
  pBVar1 = be[-10].vt;
  if ((pBVar1 != (BackendVtable *)0x0) && (*(int *)&be[-7].interactor == 1)) {
    local_28[0] = -1;
    local_28[1] = -6;
    local_28[2] = 0x1f;
    local_28[3] = (char)((uint)width >> 8);
    lVar5 = 4;
    if ((~width & 0xff00U) == 0) {
      local_28[4] = 0xff;
      lVar5 = 5;
    }
    local_28[lVar5] = (char)width;
    uVar4 = lVar5 + 1;
    if ((char)width == -1) {
      uVar4 = (ulong)((uint)lVar5 | 2);
      local_28[lVar5 + 1] = -1;
    }
    local_28[uVar4] = (char)((uint)height >> 8);
    uVar3 = uVar4 + 1;
    if ((~height & 0xff00U) == 0) {
      local_28[uVar4 + 1] = -1;
      uVar3 = (ulong)((int)uVar4 + 2);
    }
    local_28[uVar3] = (char)height;
    uVar4 = uVar3 + 1;
    if ((char)height == -1) {
      local_28[uVar3 + 1] = -1;
      uVar4 = (ulong)((int)uVar3 + 2);
    }
    (local_28 + uVar4)[0] = -1;
    (local_28 + uVar4)[1] = -0x10;
    pIVar2 = (Interactor *)(**(code **)(pBVar1->init + 0x10))(pBVar1,local_28,(int)uVar4 + 2);
    be[-4].interactor = pIVar2;
    logeventf((LogContext *)be[-9].interactor,"client subnegotiation: SB NAWS %d,%d",
              (ulong)*(uint *)&be[-8].interactor,(ulong)*(uint *)((long)&be[-8].interactor + 4));
  }
  return;
}

Assistant:

static void telnet_size(Backend *be, int width, int height)
{
    Telnet *telnet = container_of(be, Telnet, backend);
    unsigned char b[24];
    int n;

    telnet->term_width = width;
    telnet->term_height = height;

    if (telnet->s == NULL || telnet->opt_states[o_naws.index] != ACTIVE)
        return;
    n = 0;
    b[n++] = IAC;
    b[n++] = SB;
    b[n++] = TELOPT_NAWS;
    b[n++] = telnet->term_width >> 8;
    if (b[n-1] == IAC) b[n++] = IAC;   /* duplicate any IAC byte occurs */
    b[n++] = telnet->term_width & 0xFF;
    if (b[n-1] == IAC) b[n++] = IAC;   /* duplicate any IAC byte occurs */
    b[n++] = telnet->term_height >> 8;
    if (b[n-1] == IAC) b[n++] = IAC;   /* duplicate any IAC byte occurs */
    b[n++] = telnet->term_height & 0xFF;
    if (b[n-1] == IAC) b[n++] = IAC;   /* duplicate any IAC byte occurs */
    b[n++] = IAC;
    b[n++] = SE;
    telnet->bufsize = sk_write(telnet->s, b, n);
    logeventf(telnet->logctx, "client subnegotiation: SB NAWS %d,%d",
              telnet->term_width, telnet->term_height);
}